

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pyi_generator.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::python::PyiGenerator::Generate
          (PyiGenerator *this,FileDescriptor *file,string *parameter,GeneratorContext *context,
          string *error)

{
  Options options_00;
  pointer ppVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  undefined4 extraout_var;
  FileDescriptor *pFVar6;
  EnumDescriptor *pEVar7;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *output_00;
  AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo> *annotation_collector_00;
  pointer __lhs;
  int i;
  string *psVar8;
  int i_1;
  int index;
  string_view text;
  string_view text_00;
  string_view suffix;
  string_view suffix_00;
  string_view text_01;
  MutexLock lock;
  string filename;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  options;
  GeneratedCodeInfo annotations;
  AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo> annotation_collector;
  Options printer_opt;
  Printer printer;
  ZeroCopyOutputStream *output;
  
  lock.mu_ = &this->mutex_;
  output_00 = (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)context;
  psVar8 = error;
  absl::lts_20250127::Mutex::Lock(lock.mu_);
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::clear((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)&this->import_map_);
  this->file_ = file;
  options.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  options.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  options.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  text._M_str = (char *)&options;
  text._M_len = (size_t)(parameter->_M_dataplus)._M_p;
  ParseGeneratorParameter((compiler *)parameter->_M_string_length,text,output_00);
  ppVar1 = options.
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  filename._M_dataplus._M_p = (pointer)&filename.field_2;
  filename._M_string_length = 0;
  bVar4 = false;
  filename.field_2._M_local_buf[0] = '\0';
  this->strip_nonfunctional_codegen_ = false;
  __lhs = options.
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (__lhs == ppVar1) {
      if (filename._M_string_length == 0) {
        suffix._M_str = (char *)psVar8;
        suffix._M_len = (size_t)".pyi";
        GetFileName_abi_cxx11_((string *)&printer,(python *)file,(FileDescriptor *)0x4,suffix);
        std::__cxx11::string::operator=((string *)&filename,(string *)&printer);
        std::__cxx11::string::~string((string *)&printer);
      }
      iVar5 = (*context->_vptr_GeneratorContext[2])(context,&filename);
      output = (ZeroCopyOutputStream *)CONCAT44(extraout_var,iVar5);
      if (output == (ZeroCopyOutputStream *)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&printer,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/python/pyi_generator.cc"
                   ,0x272,"output.get()");
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&printer);
      }
      GeneratedCodeInfo::GeneratedCodeInfo(&annotations);
      annotation_collector.super_AnnotationCollector._vptr_AnnotationCollector =
           (_func_int **)&PTR__AnnotationCollector_007931c8;
      annotation_collector_00 = (AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo> *)0x0
      ;
      if (bVar4) {
        annotation_collector_00 = &annotation_collector;
      }
      annotation_collector.annotation_proto_ = &annotations;
      io::Printer::Options::Options
                (&printer_opt,'$',&annotation_collector_00->super_AnnotationCollector);
      printer_opt.spaces_per_indent = 4;
      options_00.annotation_collector = printer_opt.annotation_collector;
      options_00.variable_delimiter = printer_opt.variable_delimiter;
      options_00._1_7_ = printer_opt._1_7_;
      options_00.comment_start._M_len = printer_opt.comment_start._M_len;
      options_00.comment_start._M_str = printer_opt.comment_start._M_str;
      options_00.ignored_comment_start._M_len = printer_opt.ignored_comment_start._M_len;
      options_00.ignored_comment_start._M_str = printer_opt.ignored_comment_start._M_str;
      options_00.spaces_per_indent = 4;
      options_00.enable_codegen_trace.super__Optional_base<bool,_true,_true>._M_payload.
      super__Optional_payload_base<bool> =
           printer_opt.enable_codegen_trace.super__Optional_base<bool,_true,_true>._M_payload.
           super__Optional_payload_base<bool>;
      options_00._58_6_ = printer_opt._58_6_;
      io::Printer::Printer(&printer,output,options_00);
      this->printer_ = &printer;
      PrintImports(this);
      text_00._M_str = "DESCRIPTOR: _descriptor.FileDescriptor\n";
      text_00._M_len = 0x27;
      io::Printer::Print<>(this->printer_,text_00);
      for (iVar5 = 0; iVar5 < this->file_->public_dependency_count_; iVar5 = iVar5 + 1) {
        pFVar6 = FileDescriptor::public_dependency(this->file_,iVar5);
        PrintExtensions<google::protobuf::FileDescriptor>(this,pFVar6);
        for (index = 0; index < pFVar6->enum_type_count_; index = index + 1) {
          pEVar7 = FileDescriptor::enum_type(pFVar6,index);
          PrintEnumValues(this,pEVar7,false);
        }
      }
      PrintTopLevelEnums(this);
      for (iVar5 = 0; pFVar6 = this->file_, iVar5 < pFVar6->enum_type_count_; iVar5 = iVar5 + 1) {
        pEVar7 = FileDescriptor::enum_type(pFVar6,iVar5);
        PrintEnumValues(this,pEVar7,false);
      }
      PrintExtensions<google::protobuf::FileDescriptor>(this,pFVar6);
      PrintMessages(this);
      if (this->opensource_runtime_ == true) {
        bVar4 = HasGenericServices(file);
        if (bVar4) {
          PrintServices(this);
        }
      }
      io::Printer::~Printer(&printer);
      GeneratedCodeInfo::~GeneratedCodeInfo(&annotations);
      (*output->_vptr_ZeroCopyOutputStream[1])();
LAB_001a3e16:
      std::__cxx11::string::~string((string *)&filename);
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector(&options);
      absl::lts_20250127::MutexLock::~MutexLock(&lock);
      return __lhs == ppVar1;
    }
    bVar3 = std::operator==(&__lhs->first,"annotate_code");
    bVar2 = true;
    if (!bVar3) {
      suffix_00._M_str = ".pyi";
      suffix_00._M_len = 4;
      text_01._M_str = (__lhs->first)._M_dataplus._M_p;
      text_01._M_len = (__lhs->first)._M_string_length;
      bVar3 = absl::lts_20250127::EndsWith(text_01,suffix_00);
      bVar2 = bVar4;
      if (bVar3) {
        std::__cxx11::string::_M_assign((string *)&filename);
      }
      else {
        bVar4 = std::operator==(&__lhs->first,"experimental_strip_nonfunctional_codegen");
        if (!bVar4) {
          printer.sink_._0_16_ =
               absl::lts_20250127::NullSafeStringView("Unknown generator option: ");
          printer_opt.annotation_collector = (AnnotationCollector *)(__lhs->first)._M_dataplus._M_p;
          printer_opt._0_8_ = (__lhs->first)._M_string_length;
          absl::lts_20250127::StrCat_abi_cxx11_
                    ((string *)&annotations,(lts_20250127 *)&printer,(AlphaNum *)&printer_opt,
                     (AlphaNum *)printer_opt._0_8_);
          std::__cxx11::string::operator=((string *)error,(string *)&annotations);
          std::__cxx11::string::~string((string *)&annotations);
          goto LAB_001a3e16;
        }
        this->strip_nonfunctional_codegen_ = true;
      }
    }
    bVar4 = bVar2;
    __lhs = __lhs + 1;
  } while( true );
}

Assistant:

bool PyiGenerator::Generate(const FileDescriptor* file,
                            const std::string& parameter,
                            GeneratorContext* context,
                            std::string* error) const {
  absl::MutexLock lock(&mutex_);
  import_map_.clear();
  // Calculate file name.
  file_ = file;
  // In google3, devtools/python/bazel/pytype/pytype_impl.bzl uses --pyi_out to
  // directly set the output file name.
  std::vector<std::pair<std::string, std::string> > options;
  ParseGeneratorParameter(parameter, &options);

  std::string filename;
  bool annotate_code = false;
  strip_nonfunctional_codegen_ = false;
  for (const std::pair<std::string, std::string>& option : options) {
    if (option.first == "annotate_code") {
      annotate_code = true;
    } else if (absl::EndsWith(option.first, ".pyi")) {
      filename = option.first;
    } else if (option.first == "experimental_strip_nonfunctional_codegen") {
      strip_nonfunctional_codegen_ = true;
    } else {
      *error = absl::StrCat("Unknown generator option: ", option.first);
      return false;
    }
  }

  if (filename.empty()) {
    filename = GetFileName(file, ".pyi");
  }

  std::unique_ptr<io::ZeroCopyOutputStream> output(context->Open(filename));
  ABSL_CHECK(output.get());
  GeneratedCodeInfo annotations;
  io::AnnotationProtoCollector<GeneratedCodeInfo> annotation_collector(
      &annotations);
  io::Printer::Options printer_opt(
      '$', annotate_code ? &annotation_collector : nullptr);
  printer_opt.spaces_per_indent = 4;
  io::Printer printer(output.get(), printer_opt);
  printer_ = &printer;

  PrintImports();
  printer_->Print("DESCRIPTOR: _descriptor.FileDescriptor\n");

  // Prints extensions and enums from imports.
  for (int i = 0; i < file_->public_dependency_count(); ++i) {
    const FileDescriptor* public_dep = file_->public_dependency(i);
    PrintExtensions(*public_dep);
    for (int i = 0; i < public_dep->enum_type_count(); ++i) {
      const EnumDescriptor* enum_descriptor = public_dep->enum_type(i);
      PrintEnumValues(*enum_descriptor);
    }
  }

  PrintTopLevelEnums();
  // Prints top level enum values
  for (int i = 0; i < file_->enum_type_count(); ++i) {
    PrintEnumValues(*file_->enum_type(i));
  }
  // Prints top level Extensions
  PrintExtensions(*file_);
  PrintMessages();

  if (opensource_runtime_ && HasGenericServices(file)) {
    PrintServices();
  }
  return true;
}